

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkTrasferNames(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkPiNum(pNtk);
  iVar3 = Abc_NtkPiNum(pNtkNew);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x90,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkPoNum(pNtk);
  iVar3 = Abc_NtkPoNum(pNtkNew);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x91,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkBoxNum(pNtk);
  iVar3 = Abc_NtkBoxNum(pNtkNew);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkBoxNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x92,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = Nm_ManNumEntries(pNtk->pManName);
  if (iVar2 < 1) {
    __assert_fail("Nm_ManNumEntries(pNtk->pManName) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x93,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = Nm_ManNumEntries(pNtkNew->pManName);
  if (iVar2 != 0) {
    __assert_fail("Nm_ManNumEntries(pNtkNew->pManName) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x94,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  for (local_24 = 0; iVar2 = Abc_NtkCiNum(pNtk), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_24);
    pAVar1 = (pAVar4->field_6).pCopy;
    pAVar4 = Abc_ObjFanout0Ntk(pAVar4);
    pcVar5 = Abc_ObjName(pAVar4);
    Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
  }
  for (local_24 = 0; iVar2 = Abc_NtkCoNum(pNtk), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,local_24);
    pAVar1 = (pAVar4->field_6).pCopy;
    pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
    pcVar5 = Abc_ObjName(pAVar4);
    Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar4 = Abc_NtkBox(pNtk,local_24);
    pAVar1 = (pAVar4->field_6).pCopy;
    pcVar5 = Abc_ObjName(pAVar4);
    Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
  }
  return;
}

Assistant:

void Abc_NtkTrasferNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkBoxNum(pNtkNew) );
    assert( Nm_ManNumEntries(pNtk->pManName) > 0 );
    assert( Nm_ManNumEntries(pNtkNew->pManName) == 0 );
    // copy the CI/CO/box names
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
    Abc_NtkForEachCo( pNtk, pObj, i ) 
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
    Abc_NtkForEachBox( pNtk, pObj, i ) 
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
}